

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_TestShell::
TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_TestShell
          (TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_TestShell *this)

{
  TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_CommandLineArguments_setExcludeGroupFilterSameParameter_TestShell_003cb1a0;
  return;
}

Assistant:

TEST(CommandLineArguments, setExcludeGroupFilterSameParameter)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-xggroup" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.invertMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
}